

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.h
# Opt level: O2

void __thiscall Dyndeps::~Dyndeps(Dyndeps *this)

{
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&(this->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&(this->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  return;
}

Assistant:

Dyndeps() : used_(false), restat_(false) {}